

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

void __thiscall iDynTree::LinkPositions::LinkPositions(LinkPositions *this,Model *model)

{
  Model *in_RDI;
  LinkPositions *in_stack_ffffffffffffffe0;
  
  std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::vector
            ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x4373fc);
  resize(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

LinkPositions::LinkPositions(const Model& model)
{
    resize(model);
}